

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  uint v1;
  char *failure_msg;
  void **ppvVar1;
  Rep *pRVar2;
  int line;
  ulong uVar3;
  ulong uVar4;
  LogMessageFatal LStack_38;
  
  if (this->tagged_rep_or_elem_ == (void *)0x0) {
    failure_msg = "NeedsDestroy()";
    line = 0xee;
LAB_00c781fa:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
  }
  if (this->arena_ == (Arena *)0x0) {
    v1 = allocated_size(this);
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (v1,this->capacity_proxy_ + 1,"n <= Capacity()");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      line = 0xf6;
      goto LAB_00c781fa;
    }
    ppvVar1 = elements(this);
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)v1) {
      uVar4 = (ulong)v1;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      InternalOutOfLineDeleteMessageLite((MessageLite *)ppvVar1[uVar3]);
    }
    if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
      pRVar2 = rep(this);
      operator_delete(pRVar2,(long)this->capacity_proxy_ * 8 + 0x10);
      return;
    }
  }
  return;
}

Assistant:

inline bool NeedsDestroy() const {
    // Either there is an allocated element in SSO buffer or there is an
    // allocated Rep.
    return tagged_rep_or_elem_ != nullptr;
  }